

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_constant_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::EliminateDeadConstantPass::Process(EliminateDeadConstantPass *this)

{
  IRContext *this_00;
  size_t sVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DefUseManager *pDVar4;
  mapped_type *pmVar5;
  Operand *pOVar6;
  size_type sVar7;
  pointer ppIVar8;
  __node_base *p_Var9;
  bool bVar10;
  __ireturn_type _Var11;
  size_t count;
  Instruction *def_inst;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  dead_consts;
  Instruction *c;
  size_t local_c8;
  size_t sStack_c0;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  working_list;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> constants;
  unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
  use_counts;
  
  working_list._M_h._M_buckets = &working_list._M_h._M_single_bucket;
  working_list._M_h._M_bucket_count = 1;
  working_list._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  working_list._M_h._M_element_count = 0;
  working_list._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  working_list._M_h._M_rehash_policy._M_next_resize = 0;
  working_list._M_h._M_single_bucket = (__node_base_ptr)0x0;
  use_counts._M_h._M_buckets = &use_counts._M_h._M_single_bucket;
  use_counts._M_h._M_bucket_count = 1;
  use_counts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  use_counts._M_h._M_element_count = 0;
  use_counts._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  use_counts._M_h._M_rehash_policy._M_next_resize = 0;
  use_counts._M_h._M_single_bucket = (__node_base_ptr)0x0;
  IRContext::GetConstants(&constants,(this->super_Pass).context_);
  for (ppIVar8 = constants.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar8 !=
      constants.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppIVar8 = ppIVar8 + 1) {
    c = *ppIVar8;
    uVar2 = Instruction::result_id(c);
    count = 0;
    pDVar4 = IRContext::get_def_use_mgr((this->super_Pass).context_);
    dead_consts._M_h._M_bucket_count = 0;
    dead_consts._M_h._M_element_count =
         (size_type)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_constant_pass.cpp:40:19)>
         ::_M_invoke;
    dead_consts._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_constant_pass.cpp:40:19)>
         ::_M_manager;
    dead_consts._M_h._M_buckets = (__buckets_ptr)&count;
    analysis::DefUseManager::ForEachUse
              (pDVar4,uVar2,
               (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&dead_consts);
    if (dead_consts._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)dead_consts._M_h._M_before_begin._M_nxt)
                ((function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&dead_consts,
                 (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&dead_consts,3);
    }
    sVar1 = count;
    pmVar5 = std::__detail::
             _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&use_counts,&c);
    *pmVar5 = sVar1;
    if (count == 0) {
      std::__detail::
      _Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&working_list,&c);
    }
  }
  dead_consts._M_h._M_buckets = &dead_consts._M_h._M_single_bucket;
  dead_consts._M_h._M_bucket_count = 1;
  p_Var9 = &dead_consts._M_h._M_before_begin;
  dead_consts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dead_consts._M_h._M_element_count = 0;
  dead_consts._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  dead_consts._M_h._M_rehash_policy._M_next_resize = 0;
  dead_consts._M_h._M_single_bucket = (__node_base_ptr)0x0;
  do {
    if (working_list._M_h._M_element_count == 0) {
      while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
        this_00 = (this->super_Pass).context_;
        uVar2 = Instruction::result_id((Instruction *)p_Var9[1]._M_nxt);
        IRContext::KillDef(this_00,uVar2);
      }
      bVar10 = dead_consts._M_h._M_element_count == 0;
      std::
      _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&dead_consts._M_h);
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&constants.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
      std::
      _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&use_counts._M_h);
      std::
      _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&working_list._M_h);
      return bVar10 + SuccessWithChange;
    }
    count = (size_t)working_list._M_h._M_before_begin._M_nxt[1]._M_nxt;
    if (((ulong)*(uint *)&((_Hash_node_base *)(count + 0x28))->_M_nxt < 0x35) &&
       ((0x18100000000000U >> ((ulong)*(uint *)&((_Hash_node_base *)(count + 0x28))->_M_nxt & 0x3f)
        & 1) != 0)) {
      uVar2 = 0;
      while( true ) {
        uVar3 = Instruction::NumInOperands((Instruction *)count);
        if (uVar3 <= uVar2) break;
        pOVar6 = Instruction::GetInOperand((Instruction *)count,uVar2);
        if (pOVar6->type == SPV_OPERAND_TYPE_ID) {
          uVar3 = Instruction::GetSingleWordInOperand((Instruction *)count,uVar2);
          pDVar4 = IRContext::get_def_use_mgr((this->super_Pass).context_);
          def_inst = analysis::DefUseManager::GetDef(pDVar4,uVar3);
          sVar7 = std::
                  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(&use_counts._M_h,&def_inst);
          if (sVar7 != 0) {
            pmVar5 = std::__detail::
                     _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&use_counts._M_h,&def_inst);
            if (*pmVar5 == 0) {
              c = (Instruction *)0x50;
              local_c8 = 0;
              sStack_c0 = 0;
              Log(&(this->super_Pass).consumer_,SPV_MSG_INTERNAL_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_constant_pass.cpp"
                  ,(spv_position_t *)&c,"assertion failed: use_counts[def_inst] > 0");
              exit(1);
            }
            pmVar5 = std::__detail::
                     _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&use_counts._M_h,&def_inst);
            *pmVar5 = *pmVar5 - 1;
            pmVar5 = std::__detail::
                     _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&use_counts._M_h,&def_inst);
            if (*pmVar5 == 0) {
              std::__detail::
              _Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&working_list,&def_inst);
            }
          }
        }
        uVar2 = uVar2 + 1;
      }
    }
    _Var11 = std::__detail::
             _Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::insert((_Insert_base<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&dead_consts,(value_type *)&count);
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&working_list._M_h,&count,_Var11._8_8_);
  } while( true );
}

Assistant:

Pass::Status EliminateDeadConstantPass::Process() {
  std::unordered_set<Instruction*> working_list;
  // Traverse all the instructions to get the initial set of dead constants as
  // working list and count number of real uses for constants. Uses in
  // annotation instructions do not count.
  std::unordered_map<Instruction*, size_t> use_counts;
  std::vector<Instruction*> constants = context()->GetConstants();
  for (auto* c : constants) {
    uint32_t const_id = c->result_id();
    size_t count = 0;
    context()->get_def_use_mgr()->ForEachUse(
        const_id, [&count](Instruction* user, uint32_t index) {
          (void)index;
          spv::Op op = user->opcode();
          if (!(IsAnnotationInst(op) || IsDebug1Inst(op) || IsDebug2Inst(op) ||
                IsDebug3Inst(op))) {
            ++count;
          }
        });
    use_counts[c] = count;
    if (!count) {
      working_list.insert(c);
    }
  }

  // Start from the constants with 0 uses, back trace through the def-use chain
  // to find all dead constants.
  std::unordered_set<Instruction*> dead_consts;
  while (!working_list.empty()) {
    Instruction* inst = *working_list.begin();
    // Back propagate if the instruction contains IDs in its operands.
    switch (inst->opcode()) {
      case spv::Op::OpConstantComposite:
      case spv::Op::OpSpecConstantComposite:
      case spv::Op::OpSpecConstantOp:
        for (uint32_t i = 0; i < inst->NumInOperands(); i++) {
          // SpecConstantOp instruction contains 'opcode' as its operand. Need
          // to exclude such operands when decreasing uses.
          if (inst->GetInOperand(i).type != SPV_OPERAND_TYPE_ID) {
            continue;
          }
          uint32_t operand_id = inst->GetSingleWordInOperand(i);
          Instruction* def_inst =
              context()->get_def_use_mgr()->GetDef(operand_id);
          // If the use_count does not have any count for the def_inst,
          // def_inst must not be a constant, and should be ignored here.
          if (!use_counts.count(def_inst)) {
            continue;
          }
          // The number of uses should never be less then 0, so it can not be
          // less than 1 before it decreases.
          SPIRV_ASSERT(consumer(), use_counts[def_inst] > 0);
          --use_counts[def_inst];
          if (!use_counts[def_inst]) {
            working_list.insert(def_inst);
          }
        }
        break;
      default:
        break;
    }
    dead_consts.insert(inst);
    working_list.erase(inst);
  }

  // Turn all dead instructions and uses of them to nop
  for (auto* dc : dead_consts) {
    context()->KillDef(dc->result_id());
  }
  return dead_consts.empty() ? Status::SuccessWithoutChange
                             : Status::SuccessWithChange;
}